

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeMemGrow(Mem *pMem,int n,int bPreserve)

{
  uint uVar1;
  char *pOld;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  
  if (bPreserve == 0 || pMem->szMalloc < 1) {
    if (0 < pMem->szMalloc) {
      pcVar3 = pMem->zMalloc;
      goto LAB_00165386;
    }
  }
  else {
    pOld = pMem->z;
    pcVar3 = pMem->zMalloc;
    if (pOld == pcVar3) {
      if (pMem->db == (sqlite3 *)0x0) {
        pcVar3 = (char *)sqlite3Realloc(pOld,(long)n);
        pMem->zMalloc = pcVar3;
        if (pcVar3 == (char *)0x0) {
          sqlite3_free(pMem->z);
          pcVar3 = pMem->zMalloc;
        }
      }
      else {
        pcVar3 = (char *)sqlite3DbReallocOrFree(pMem->db,pOld,(long)n);
        pMem->zMalloc = pcVar3;
      }
      pMem->z = pcVar3;
      bVar4 = true;
      goto LAB_001653a8;
    }
LAB_00165386:
    sqlite3DbFreeNN(pMem->db,pcVar3);
  }
  pcVar3 = (char *)sqlite3DbMallocRaw(pMem->db,(long)n);
  pMem->zMalloc = pcVar3;
  bVar4 = bPreserve == 0;
LAB_001653a8:
  if (pcVar3 == (char *)0x0) {
    sqlite3VdbeMemSetNull(pMem);
    pMem->z = (char *)0x0;
    pMem->szMalloc = 0;
    iVar2 = 7;
  }
  else {
    iVar2 = sqlite3DbMallocSize(pMem->db,pcVar3);
    pMem->szMalloc = iVar2;
    if ((!bVar4) && (pMem->z != (char *)0x0)) {
      memcpy(pMem->zMalloc,pMem->z,(long)pMem->n);
    }
    uVar1._0_2_ = pMem->flags;
    uVar1._2_1_ = pMem->enc;
    uVar1._3_1_ = pMem->eSubtype;
    if ((uVar1 >> 0xc & 1) != 0) {
      (*pMem->xDel)(pMem->z);
      uVar1._0_2_ = pMem->flags;
    }
    pMem->z = pMem->zMalloc;
    pMem->flags = (ushort)uVar1 & 0x8fff;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int sqlite3VdbeMemGrow(Mem *pMem, int n, int bPreserve){
  assert( sqlite3VdbeCheckMemInvariants(pMem) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  testcase( pMem->db==0 );

  /* If the bPreserve flag is set to true, then the memory cell must already
  ** contain a valid string or blob value.  */
  assert( bPreserve==0 || pMem->flags&(MEM_Blob|MEM_Str) );
  testcase( bPreserve && pMem->z==0 );

  assert( pMem->szMalloc==0
       || (pMem->flags==MEM_Undefined
           && pMem->szMalloc<=sqlite3DbMallocSize(pMem->db,pMem->zMalloc))
       || pMem->szMalloc==sqlite3DbMallocSize(pMem->db,pMem->zMalloc));
  if( pMem->szMalloc>0 && bPreserve && pMem->z==pMem->zMalloc ){
    if( pMem->db ){
      pMem->z = pMem->zMalloc = sqlite3DbReallocOrFree(pMem->db, pMem->z, n);
    }else{
      pMem->zMalloc = sqlite3Realloc(pMem->z, n);
      if( pMem->zMalloc==0 ) sqlite3_free(pMem->z);
      pMem->z = pMem->zMalloc;
    }
    bPreserve = 0;
  }else{
    if( pMem->szMalloc>0 ) sqlite3DbFreeNN(pMem->db, pMem->zMalloc);
    pMem->zMalloc = sqlite3DbMallocRaw(pMem->db, n);
  }
  if( pMem->zMalloc==0 ){
    sqlite3VdbeMemSetNull(pMem);
    pMem->z = 0;
    pMem->szMalloc = 0;
    return SQLITE_NOMEM_BKPT;
  }else{
    pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->zMalloc);
  }

  if( bPreserve && pMem->z ){
    assert( pMem->z!=pMem->zMalloc );
    memcpy(pMem->zMalloc, pMem->z, pMem->n);
  }
  if( (pMem->flags&MEM_Dyn)!=0 ){
    assert( pMem->xDel!=0 && pMem->xDel!=SQLITE_DYNAMIC );
    pMem->xDel((void *)(pMem->z));
  }

  pMem->z = pMem->zMalloc;
  pMem->flags &= ~(MEM_Dyn|MEM_Ephem|MEM_Static);
  return SQLITE_OK;
}